

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAlloc.h
# Opt level: O0

void __thiscall
glslang::TAllocation::TAllocation(TAllocation *this,size_t size,uchar *mem,TAllocation *prev)

{
  uchar *puVar1;
  TAllocation *prev_local;
  uchar *mem_local;
  size_t size_local;
  TAllocation *this_local;
  
  this->size = size;
  this->mem = mem;
  this->prevAlloc = prev;
  puVar1 = preGuard(this);
  memset(puVar1,0xfb,0x10);
  puVar1 = data(this);
  memset(puVar1,0xcd,size);
  puVar1 = postGuard(this);
  memset(puVar1,0xfe,0x10);
  return;
}

Assistant:

TAllocation(size_t size, unsigned char* mem, TAllocation* prev = nullptr) :
        size(size), mem(mem), prevAlloc(prev) {
        // Allocations are bracketed:
        //    [allocationHeader][initialGuardBlock][userData][finalGuardBlock]
        // This would be cleaner with if (guardBlockSize)..., but that
        // makes the compiler print warnings about 0 length memsets,
        // even with the if() protecting them.
#       ifdef GUARD_BLOCKS
            memset(preGuard(),  guardBlockBeginVal, guardBlockSize);
            memset(data(),      userDataFill,       size);
            memset(postGuard(), guardBlockEndVal,   guardBlockSize);
#       endif
    }